

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O0

void act_var_rescale(sat_solver3 *s)

{
  word *pwVar1;
  int iVar2;
  word wVar3;
  xdbl xVar4;
  double dVar5;
  int local_3c;
  int i_2;
  xdbl *activity_2;
  int i_1;
  double *activity_1;
  int i;
  word *activity;
  sat_solver3 *s_local;
  
  if (s->VarActType == 0) {
    pwVar1 = s->activity;
    for (activity_1._4_4_ = 0; activity_1._4_4_ < s->size; activity_1._4_4_ = activity_1._4_4_ + 1)
    {
      pwVar1[activity_1._4_4_] = pwVar1[activity_1._4_4_] >> 0x13;
    }
    s->var_inc = s->var_inc >> 0x13;
    iVar2 = Abc_MaxInt((int)s->var_inc,0x10);
    s->var_inc = (long)iVar2;
  }
  else if (s->VarActType == 1) {
    pwVar1 = s->activity;
    for (activity_2._4_4_ = 0; activity_2._4_4_ < s->size; activity_2._4_4_ = activity_2._4_4_ + 1)
    {
      pwVar1[activity_2._4_4_] = (word)((double)pwVar1[activity_2._4_4_] * 1e-100);
    }
    dVar5 = Abc_Word2Dbl(s->var_inc);
    wVar3 = Abc_Dbl2Word(dVar5 * 1e-100);
    s->var_inc = wVar3;
  }
  else {
    if (s->VarActType != 2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                    ,0x129,"void act_var_rescale(sat_solver3 *)");
    }
    pwVar1 = s->activity;
    for (local_3c = 0; local_3c < s->size; local_3c = local_3c + 1) {
      xVar4 = Xdbl_Div(pwVar1[local_3c],200);
      pwVar1[local_3c] = xVar4;
    }
    xVar4 = Xdbl_Div(s->var_inc,200);
    s->var_inc = xVar4;
  }
  return;
}

Assistant:

static inline void act_var_rescale(sat_solver* s)  
{
    if ( s->VarActType == 0 )
    {
        word* activity = s->activity;
        int i;
        for (i = 0; i < s->size; i++)
            activity[i] >>= 19;
        s->var_inc >>= 19;
        s->var_inc = Abc_MaxInt( (unsigned)s->var_inc, (1<<4) );
    }
    else if ( s->VarActType == 1 )
    {
        double* activity = (double*)s->activity;
        int i;
        for (i = 0; i < s->size; i++)
            activity[i] *= 1e-100;
        s->var_inc = Abc_Dbl2Word( Abc_Word2Dbl(s->var_inc) * 1e-100 );
        //printf( "Rescaling var activity...\n" ); 
    }
    else if ( s->VarActType == 2 )
    {
        xdbl * activity = s->activity;
        int i;
        for (i = 0; i < s->size; i++)
            activity[i] = Xdbl_Div( activity[i], 200 ); // activity[i] / 2^200
        s->var_inc = Xdbl_Div( s->var_inc, 200 ); 
    }
    else assert(0);
}